

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O2

UBool __thiscall icu_63::DateFormat::isLenient(DateFormat *this)

{
  UBool UVar1;
  uint in_EAX;
  int iVar2;
  bool bVar3;
  uint uStack_18;
  UErrorCode status;
  
  if (this->fCalendar == (Calendar *)0x0) {
    _uStack_18 = (ulong)in_EAX;
  }
  else {
    uStack_18 = in_EAX;
    UVar1 = Calendar::isLenient(this->fCalendar);
    _uStack_18 = (ulong)uStack_18;
    if (UVar1 == '\0') {
      return '\0';
    }
  }
  bVar3 = false;
  iVar2 = (*(this->super_Format).super_UObject._vptr_UObject[0x1c])(this,0,&status);
  if ((char)iVar2 != '\0') {
    iVar2 = (*(this->super_Format).super_UObject._vptr_UObject[0x1c])(this,1,&status);
    bVar3 = (char)iVar2 != '\0';
  }
  return bVar3;
}

Assistant:

UBool
DateFormat::isLenient() const
{
    UBool lenient = TRUE;
    if (fCalendar != NULL) {
        lenient = fCalendar->isLenient();
    }
    UErrorCode status = U_ZERO_ERROR;
    return lenient
        && getBooleanAttribute(UDAT_PARSE_ALLOW_WHITESPACE, status)
        && getBooleanAttribute(UDAT_PARSE_ALLOW_NUMERIC, status);
}